

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,IfNode *ifNode)

{
  ExpNode *pEVar1;
  StmtNode *pSVar2;
  undefined1 uVar3;
  
  pEVar1 = ifNode->head;
  if (pEVar1 != (ExpNode *)0x0) {
    (*(pEVar1->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar1,this);
    pSVar2 = ifNode->trueStmt;
    if (pSVar2 != (StmtNode *)0x0) {
      (*(pSVar2->super_ASTNode)._vptr_ASTNode[3])(pSVar2,this);
    }
    pSVar2 = ifNode->falseStmt;
    if (pSVar2 != (StmtNode *)0x0) {
      (*(pSVar2->super_ASTNode)._vptr_ASTNode[3])(pSVar2,this);
    }
    if (ifNode->head->type != 8) {
      fprintf(_stderr,"[SEMANTIC ERROR - ifNode] CONDITION EXPRESSION MUST BE BOOLEAN, line: %d\n",
              (ulong)(uint)(ifNode->super_StmtNode).super_ASTNode.line);
    }
    if (((ifNode->falseStmt == (StmtNode *)0x0) || (ifNode->trueStmt == (StmtNode *)0x0)) ||
       ((ifNode->trueStmt->super_ASTNode).field_0xc != '\x01')) {
      uVar3 = 0;
    }
    else {
      uVar3 = (ifNode->falseStmt->super_ASTNode).field_0xc;
    }
    (ifNode->super_StmtNode).super_ASTNode.field_0xc = uVar3;
    return;
  }
  fprintf(_stderr,"[SEMANTIC ERROR - ifNode] IF WITHOUT A VALID CONDITION, line: %d\n",
          (ulong)(uint)(ifNode->super_StmtNode).super_ASTNode.line);
  return;
}

Assistant:

void SemanticTypes::visit(IfNode *ifNode) {
    if (ifNode->getHead()) {
        ifNode->getHead()->accept(this);
    } else {
        fprintf(stderr,
                "[SEMANTIC ERROR - ifNode] IF WITHOUT A VALID CONDITION, line: %d\n",
                ifNode->getLine());
        return;
    }

    if (ifNode->getTrueStmt()) {
        ifNode->getTrueStmt()->accept(this);
    }

    if (ifNode->getFalseStmt()) {
        ifNode->getFalseStmt()->accept(this);
    }

    if (ifNode->getHead()->getType() != BOOL) {
        fprintf(stderr,
                "[SEMANTIC ERROR - ifNode] CONDITION EXPRESSION MUST BE BOOLEAN, line: %d\n",
                ifNode->getLine());
    }

    ifNode->setReturn(ifNode->getFalseStmt() && ifNode->getTrueStmt() && ifNode->getTrueStmt()->isReturn() &&
                      ifNode->getFalseStmt()->isReturn());
}